

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExecuteCommand(cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  long *plVar4;
  ostream *poVar5;
  cmCommand *pcVar6;
  undefined4 extraout_var;
  bool bVar7;
  int d;
  cmMakefileCall stack_manager;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  istringstream s;
  
  bVar1 = IsFunctionBlocked(this,lff,status);
  if (bVar1) {
    return true;
  }
  cmMakefileCall::cmMakefileCall(&stack_manager,this,&lff->super_cmCommandContext,status);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&s,"CMAKE_MAXIMUM_RECURSION_DEPTH",(allocator<char> *)&d);
  pcVar3 = GetDefinition(this,(string *)&s);
  std::__cxx11::string::~string((string *)&s);
  if (pcVar3 == (char *)0x0) {
    iVar2 = 1000;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&d,pcVar3,(allocator<char> *)&local_1c8);
    std::__cxx11::istringstream::istringstream((istringstream *)&s,(string *)&d,_S_in);
    std::__cxx11::string::~string((string *)&d);
    plVar4 = (long *)std::istream::operator>>(&s,&d);
    iVar2 = 1000;
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) == 0) {
      iVar2 = d;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&s);
  }
  if (iVar2 < this->RecursionDepth) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&s);
    poVar5 = std::operator<<((ostream *)&s,"Maximum recursion depth of ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar2);
    std::operator<<(poVar5," exceeded");
    std::__cxx11::stringbuf::str();
    IssueMessage(this,FATAL_ERROR,(string *)&d);
    std::__cxx11::string::~string((string *)&d);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&s);
  }
  else {
    pcVar6 = cmState::GetCommandByExactName
                       ((this->GlobalGenerator->CMakeInstance->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)lff);
    if (pcVar6 != (cmCommand *)0x0) {
      iVar2 = (*pcVar6->_vptr_cmCommand[6])(pcVar6);
      pcVar6 = (cmCommand *)CONCAT44(extraout_var,iVar2);
      pcVar6->Makefile = this;
      bVar1 = cmSystemTools::GetFatalErrorOccured();
      bVar7 = true;
      if (!bVar1) {
        if (this->GlobalGenerator->CMakeInstance->Trace == true) {
          PrintCommandTrace(this,lff);
        }
        iVar2 = (*pcVar6->_vptr_cmCommand[2])(pcVar6,&lff->Arguments,status);
        if ((byte)((byte)iVar2 ^ 1 | status->NestedError) == 1) {
          if (status->NestedError == false) {
            std::__cxx11::string::string
                      ((string *)&local_1c8,(string *)&(lff->super_cmCommandContext).Name.Original);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                           &local_1c8," ");
            pcVar3 = cmCommand::GetError(pcVar6);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&s,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&d,
                           pcVar3);
            std::__cxx11::string::~string((string *)&d);
            std::__cxx11::string::~string((string *)&local_1c8);
            IssueMessage(this,FATAL_ERROR,(string *)&s);
            std::__cxx11::string::~string((string *)&s);
          }
          if (this->GlobalGenerator->CMakeInstance->CurrentWorkingMode != NORMAL_MODE) {
            cmSystemTools::s_FatalErrorOccured = true;
          }
          bVar7 = false;
        }
        else {
          iVar2 = (*pcVar6->_vptr_cmCommand[5])(pcVar6);
          if ((char)iVar2 != '\0') {
            _s = (pointer)pcVar6;
            std::vector<cmCommand*,std::allocator<cmCommand*>>::emplace_back<cmCommand*>
                      ((vector<cmCommand*,std::allocator<cmCommand*>> *)&this->FinalPassCommands,
                       (cmCommand **)&s);
            bVar7 = true;
            goto LAB_001e559d;
          }
        }
      }
      (*pcVar6->_vptr_cmCommand[1])(pcVar6);
      goto LAB_001e559d;
    }
    bVar1 = cmSystemTools::GetFatalErrorOccured();
    bVar7 = true;
    if (bVar1) goto LAB_001e559d;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&s,"Unknown CMake command \"",(allocator<char> *)&d);
    std::__cxx11::string::append((string *)&s);
    std::__cxx11::string::append((char *)&s);
    IssueMessage(this,FATAL_ERROR,(string *)&s);
    cmSystemTools::s_FatalErrorOccured = true;
    std::__cxx11::string::~string((string *)&s);
  }
  bVar7 = false;
LAB_001e559d:
  cmMakefileCall::~cmMakefileCall(&stack_manager);
  return bVar7;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  int depth = CMake_DEFAULT_RECURSION_LIMIT;
  const char* depthStr = this->GetDefinition("CMAKE_MAXIMUM_RECURSION_DEPTH");
  if (depthStr) {
    std::istringstream s(depthStr);
    int d;
    if (s >> d) {
      depth = d;
    }
  }
  if (this->RecursionDepth > depth) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depth << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccured();
    return false;
  }

  // Lookup the command prototype.
  if (cmCommand* proto =
        this->GetState()->GetCommandByExactName(lff.Name.Lower)) {
    // Clone the prototype.
    std::unique_ptr<cmCommand> pcmd(proto->Clone());
    pcmd->SetMakefile(this);

    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccured()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff);
      }
      // Try invoking the command.
      bool invokeSucceeded = pcmd->InvokeInitialPass(lff.Arguments, status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            std::string(lff.Name.Original) + " " + pcmd->GetError();
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccured();
        }
      } else if (pcmd->HasFinalPass()) {
        // use the command
        this->FinalPassCommands.push_back(pcmd.release());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccured()) {
      std::string error = "Unknown CMake command \"";
      error += lff.Name.Original;
      error += "\".";
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccured();
    }
  }

  return result;
}